

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

NETSOCKET net_tcp_create(NETADDR bindaddr)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  NETSOCKET NVar3;
  uint in_stack_00000008;
  int socket_1;
  int socket;
  NETSOCKET sock;
  sockaddr_in6 addr_1;
  sockaddr_in addr;
  NETADDR tmpbindaddr;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  NETADDR *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  sockaddr *addr_00;
  int type;
  int in_stack_ffffffffffffffb4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  addr_00 = (sockaddr *)invalid_socket._0_8_;
  type = invalid_socket.ipv6sock;
  if ((in_stack_00000008 & 1) != 0) {
    netaddr_to_sockaddr_in
              (in_stack_ffffffffffffff80,
               (sockaddr_in *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    iVar2 = priv_net_create_socket
                      (in_stack_ffffffffffffffb4,type,addr_00,in_stack_ffffffffffffffa4,
                       in_stack_ffffffffffffffa0);
    if (-1 < iVar2) {
      addr_00 = (sockaddr *)(CONCAT44(iVar2,(int)addr_00) | 1);
    }
  }
  if ((in_stack_00000008 & 2) != 0) {
    netaddr_to_sockaddr_in6
              (in_stack_ffffffffffffff80,
               (sockaddr_in6 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    iVar2 = priv_net_create_socket
                      (in_stack_ffffffffffffffb4,type,addr_00,in_stack_ffffffffffffffa4,
                       in_stack_ffffffffffffffa0);
    if (-1 < iVar2) {
      addr_00 = (sockaddr *)((ulong)addr_00 | 2);
      type = iVar2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  NVar3.ipv6sock = type;
  NVar3._0_8_ = addr_00;
  return NVar3;
}

Assistant:

NETSOCKET net_tcp_create(NETADDR bindaddr)
{
	NETSOCKET sock = invalid_socket;
	NETADDR tmpbindaddr = bindaddr;

	if(bindaddr.type&NETTYPE_IPV4)
	{
		struct sockaddr_in addr;
		int socket = -1;

		/* bind, we should check for error */
		tmpbindaddr.type = NETTYPE_IPV4;
		netaddr_to_sockaddr_in(&tmpbindaddr, &addr);
		socket = priv_net_create_socket(AF_INET, SOCK_STREAM, (struct sockaddr *)&addr, sizeof(addr), 0);
		if(socket >= 0)
		{
			sock.type |= NETTYPE_IPV4;
			sock.ipv4sock = socket;
		}
	}

	if(bindaddr.type&NETTYPE_IPV6)
	{
		struct sockaddr_in6 addr;
		int socket = -1;

		/* bind, we should check for error */
		tmpbindaddr.type = NETTYPE_IPV6;
		netaddr_to_sockaddr_in6(&tmpbindaddr, &addr);
		socket = priv_net_create_socket(AF_INET6, SOCK_STREAM, (struct sockaddr *)&addr, sizeof(addr), 0);
		if(socket >= 0)
		{
			sock.type |= NETTYPE_IPV6;
			sock.ipv6sock = socket;
		}
	}

	/* return */
	return sock;
}